

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selfguided_avx2.c
# Opt level: O0

__m256i * boxsum_from_ii(int32_t *ii,int stride,int r)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  __m256i *palVar5;
  int in_EDX;
  int in_ESI;
  int iVar6;
  undefined4 in_register_00000034;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 in_XMM0_Qb;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 in_YMM0_H;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 in_register_00001218;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  __m256i v;
  __m256i u;
  __m256i br;
  __m256i bl;
  __m256i tr;
  __m256i tl;
  
  iVar6 = in_ESI;
  yy_loadu_256((__m256i *)(in_RDI + (long)(in_EDX + 1) * -4 + (long)((in_EDX + 1) * in_ESI) * -4),
               (void *)CONCAT44(in_register_00000034,in_ESI));
  uVar7 = in_XMM0_Qa;
  uVar10 = in_XMM0_Qb;
  uVar13 = in_YMM0_H;
  uVar16 = in_register_00001218;
  yy_loadu_256((__m256i *)(in_RDI + (long)in_EDX * 4 + (long)((in_EDX + 1) * in_ESI) * -4),
               (void *)CONCAT44(in_register_00000034,iVar6));
  uVar8 = uVar7;
  uVar11 = uVar10;
  uVar14 = uVar13;
  uVar17 = uVar16;
  yy_loadu_256((__m256i *)(in_RDI + (long)(in_EDX + 1) * -4 + (long)(in_EDX * in_ESI) * 4),
               (void *)CONCAT44(in_register_00000034,iVar6));
  uVar9 = uVar8;
  uVar12 = uVar11;
  uVar15 = uVar14;
  uVar18 = uVar17;
  palVar5 = yy_loadu_256((__m256i *)(in_RDI + (long)in_EDX * 4 + (long)(in_EDX * in_ESI) * 4),
                         (void *)CONCAT44(in_register_00000034,iVar6));
  auVar4._8_8_ = uVar10;
  auVar4._0_8_ = uVar7;
  auVar4._16_8_ = uVar13;
  auVar4._24_8_ = uVar16;
  auVar1._8_8_ = in_XMM0_Qb;
  auVar1._0_8_ = in_XMM0_Qa;
  auVar1._16_8_ = in_YMM0_H;
  auVar1._24_8_ = in_register_00001218;
  auVar1 = vpsubd_avx2(auVar4,auVar1);
  auVar3._8_8_ = uVar12;
  auVar3._0_8_ = uVar9;
  auVar3._16_8_ = uVar15;
  auVar3._24_8_ = uVar18;
  auVar2._8_8_ = uVar11;
  auVar2._0_8_ = uVar8;
  auVar2._16_8_ = uVar14;
  auVar2._24_8_ = uVar17;
  auVar2 = vpsubd_avx2(auVar3,auVar2);
  vpsubd_avx2(auVar2,auVar1);
  return palVar5;
}

Assistant:

static inline __m256i boxsum_from_ii(const int32_t *ii, int stride, int r) {
  const __m256i tl = yy_loadu_256(ii - (r + 1) - (r + 1) * stride);
  const __m256i tr = yy_loadu_256(ii + (r + 0) - (r + 1) * stride);
  const __m256i bl = yy_loadu_256(ii - (r + 1) + r * stride);
  const __m256i br = yy_loadu_256(ii + (r + 0) + r * stride);
  const __m256i u = _mm256_sub_epi32(tr, tl);
  const __m256i v = _mm256_sub_epi32(br, bl);
  return _mm256_sub_epi32(v, u);
}